

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int __thiscall icu_63::UnicodeSet::remove(UnicodeSet *this,char *__filename)

{
  UChar32 UVar1;
  UChar32 UVar2;
  UChar32 in_EDX;
  UChar32 local_24;
  int local_20;
  UChar32 range [3];
  UChar32 end_local;
  UChar32 start_local;
  UnicodeSet *this_local;
  
  range[2] = (UChar32)__filename;
  range[1] = in_EDX;
  UVar1 = pinCodePoint(range + 2);
  UVar2 = pinCodePoint(range + 1);
  if (UVar1 <= UVar2) {
    local_24 = range[2];
    local_20 = range[1] + 1;
    range[0] = 0x110000;
    retain(this,&local_24,2,'\x02');
  }
  return (int)this;
}

Assistant:

UnicodeSet& UnicodeSet::remove(UChar32 start, UChar32 end) {
    if (pinCodePoint(start) <= pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        retain(range, 2, 2);
    }
    return *this;
}